

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall llvm::Triple::setVendorName(Triple *this,StringRef Str)

{
  StringRef local_e8;
  Twine local_d8;
  Twine local_c0;
  Twine local_a8;
  StringRef local_90;
  Twine local_80;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  Triple *local_20;
  Triple *this_local;
  StringRef Str_local;
  
  Str_local.Data = (char *)Str.Length;
  this_local = (Triple *)Str.Data;
  local_20 = this;
  local_90 = getArchName(this);
  llvm::operator+(&local_80,&local_90,"-");
  Twine::Twine(&local_a8,(StringRef *)&this_local);
  llvm::operator+(&local_68,&local_80,&local_a8);
  Twine::Twine(&local_c0,"-");
  llvm::operator+(&local_50,&local_68,&local_c0);
  local_e8 = getOSAndEnvironmentName(this);
  Twine::Twine(&local_d8,&local_e8);
  llvm::operator+(&local_38,&local_50,&local_d8);
  setTriple(this,&local_38);
  return;
}

Assistant:

void Triple::setVendorName(StringRef Str) {
  setTriple(getArchName() + "-" + Str + "-" + getOSAndEnvironmentName());
}